

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_CursorPosCallback(GLFWwindow *window,double x,double y)

{
  ImVec2 IVar1;
  int iVar2;
  ImGui_ImplGlfw_Data *pIVar3;
  GLFWwindow *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  float in_stack_00000008;
  float in_stack_0000000c;
  ImGuiIO *io;
  ImGui_ImplGlfw_Data *bd;
  float local_30;
  float in_stack_ffffffffffffffd4;
  GLFWwindow *in_stack_ffffffffffffffd8;
  
  pIVar3 = ImGui_ImplGlfw_GetBackendData();
  if ((pIVar3->PrevUserCallbackCursorPos != (GLFWcursorposfun)0x0) && (in_RDI == pIVar3->Window)) {
    (*pIVar3->PrevUserCallbackCursorPos)(in_RDI,in_XMM0_Qa,in_XMM1_Qa);
  }
  iVar2 = glfwGetInputMode(in_stack_ffffffffffffffd8,(int)in_stack_ffffffffffffffd4);
  if (iVar2 != 0x34003) {
    ImGui::GetIO();
    ImGuiIO::AddMousePosEvent(io,in_stack_0000000c,in_stack_00000008);
    ImVec2::ImVec2((ImVec2 *)&local_30,(float)in_XMM0_Qa,(float)in_XMM1_Qa);
    IVar1.y = in_stack_ffffffffffffffd4;
    IVar1.x = local_30;
    pIVar3->LastValidMousePos = IVar1;
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_CursorPosCallback(GLFWwindow* window, double x, double y)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    if (bd->PrevUserCallbackCursorPos != nullptr && window == bd->Window)
        bd->PrevUserCallbackCursorPos(window, x, y);
    if (glfwGetInputMode(window, GLFW_CURSOR) == GLFW_CURSOR_DISABLED)
        return;

    ImGuiIO& io = ImGui::GetIO();
    io.AddMousePosEvent((float)x, (float)y);
    bd->LastValidMousePos = ImVec2((float)x, (float)y);
}